

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

string * __thiscall
duckdb::ART::GenerateErrorKeyName_abi_cxx11_
          (string *__return_storage_ptr__,ART *this,DataChunk *input,idx_t row_idx)

{
  undefined8 *puVar1;
  Allocator *allocator;
  reference this_00;
  pointer pEVar2;
  long *plVar3;
  reference this_01;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  size_type __n;
  DataChunk expr_chunk;
  undefined8 *local_140;
  undefined8 local_130;
  undefined8 uStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  string local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  idx_t local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  DataChunk local_b0;
  Value local_70;
  
  local_d8 = row_idx;
  DataChunk::DataChunk(&local_b0);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(&local_b0,allocator,&(this->super_BoundIndex).logical_types,0x800);
  BoundIndex::ExecuteExpressions(&this->super_BoundIndex,input,&local_b0);
  local_e0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_b0.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b0.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&(this->super_BoundIndex).unbound_expressions,__n);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[7])(local_d0,pEVar2);
      plVar3 = (long *)::std::__cxx11::string::append((char *)local_d0);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar5) {
        local_110 = *puVar5;
        lStack_108 = plVar3[3];
        local_120 = &local_110;
      }
      else {
        local_110 = *puVar5;
        local_120 = (ulong *)*plVar3;
      }
      local_118 = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      this_01 = vector<duckdb::Vector,_true>::operator[](&local_b0.data,__n);
      Vector::GetValue(&local_70,this_01,local_d8);
      Value::ToString_abi_cxx11_(&local_100,&local_70);
      uVar6 = 0xf;
      if (local_120 != &local_110) {
        uVar6 = local_110;
      }
      if (uVar6 < local_100._M_string_length + local_118) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          uVar7 = local_100.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_100._M_string_length + local_118) goto LAB_015aa040;
        puVar4 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_120);
      }
      else {
LAB_015aa040:
        puVar4 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_120,(ulong)local_100._M_dataplus._M_p);
      }
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_130 = *puVar1;
        uStack_128 = puVar4[3];
        local_140 = &local_130;
      }
      else {
        local_130 = *puVar1;
        local_140 = (undefined8 *)*puVar4;
      }
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140);
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      Value::~Value(&local_70);
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0]);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)local_b0.data.
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_b0.data.
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  DataChunk::~DataChunk(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

string ART::GenerateErrorKeyName(DataChunk &input, idx_t row_idx) {
	DataChunk expr_chunk;
	expr_chunk.Initialize(Allocator::DefaultAllocator(), logical_types);
	ExecuteExpressions(input, expr_chunk);

	string key_name;
	for (idx_t k = 0; k < expr_chunk.ColumnCount(); k++) {
		if (k > 0) {
			key_name += ", ";
		}
		key_name += unbound_expressions[k]->GetName() + ": " + expr_chunk.data[k].GetValue(row_idx).ToString();
	}
	return key_name;
}